

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Remote.cpp
# Opt level: O0

bool __thiscall
XPMP2::RmtMsgBufTy<XPMP2::RemoteAcRemoveTy,_(XPMP2::RemoteMsgTy)6,_(unsigned_char)'\x00'>::add
          (RmtMsgBufTy<XPMP2::RemoteAcRemoveTy,_(XPMP2::RemoteMsgTy)6,_(unsigned_char)__x00_> *this,
          RemoteAcRemoveTy *_elem)

{
  size_t __n;
  EVP_PKEY_CTX *in_RSI;
  RmtMsgBufTy<XPMP2::RemoteAcRemoveTy,_(XPMP2::RemoteMsgTy)6,_(unsigned_char)__x00_> *in_RDI;
  bool bVar1;
  size_t elemSize;
  
  if (in_RDI->pMsg == (void *)0x0) {
    init(in_RDI,in_RSI);
  }
  __n = RemoteAcRemoveTy::msgSize();
  bVar1 = __n <= DAT_0047dd88 - in_RDI->size;
  if (bVar1) {
    memcpy((void *)((long)in_RDI->pMsg + in_RDI->size),in_RSI,__n);
    in_RDI->elemCount = in_RDI->elemCount + 1;
    in_RDI->size = __n + in_RDI->size;
  }
  return bVar1;
}

Assistant:

bool RmtMsgBufTy<ElemTy,MsgTy,msgVer>::add (const ElemTy& _elem)
{
    // no buffer defined yet? -> do so!
    if (!pMsg) init();
        
    // no space left?
    const size_t elemSize = _elem.msgSize();
    if (glob.remoteBufSize - size < elemSize)
        return false;
    
    // Copy the element into the msg buffer
    memcpy(reinterpret_cast<char*>(pMsg) + size, &_elem, elemSize);
    ++elemCount;
    size += elemSize;
    return true;
}